

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int cfft2i_(int *l,int *m,double *wsave,int *lensav,int *ier)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *lensav_00;
  int *in_RCX;
  long in_RDX;
  double *in_RSI;
  int *in_RDI;
  undefined4 *in_R8;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int *n;
  int ier1;
  int i__1;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int *in_stack_ffffffffffffff88;
  double *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  undefined4 local_30;
  
  lensav_00 = (int *)(in_RDX + -8);
  *in_R8 = 0;
  iVar3 = *in_RCX;
  iVar1 = *in_RDI;
  dVar4 = log((double)*in_RDI);
  dVar5 = log(2.0);
  iVar2 = *(int *)in_RSI;
  dVar6 = log((double)*(int *)in_RSI);
  dVar7 = log(2.0);
  if (iVar3 < iVar1 * 2 + (int)(dVar4 / dVar5) + iVar2 * 2 + (int)(dVar6 / dVar7) + 8) {
    *in_R8 = 2;
  }
  else {
    log((double)*in_RDI);
    log(2.0);
    cfftmi_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
            (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (local_30 == 0) {
      log((double)*(int *)in_RSI);
      log(2.0);
      iVar3 = *in_RDI << 1;
      n = (int *)log((double)*in_RDI);
      log(2.0);
      cfftmi_(n,in_RSI,lensav_00,(int *)CONCAT44(iVar3,in_stack_ffffffffffffff80));
    }
    else {
      *in_R8 = 0x14;
    }
  }
  return 0;
}

Assistant:

int cfft2i_(int *l, int *m, fft_real_t *wsave, int *
	lensav, int *ier)
{
    /* System generated locals */
    int i__1;

    /* Builtin functions */


    /* Local variables */
     int ier1;
    extern /* Subroutine */ int cfftmi_(int *, fft_real_t *, int *, int
	    *), xerfft_(char *, int *, ftnlen);


/* Initialize error return */

    /* Parameter adjustments */
    --wsave;

    /* Function Body */
    *ier = 0;

    if (*lensav < (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + (*m <<
	     1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 8) {
	*ier = 2;
	//xerfft_("CFFT2I", &c__4, (ftnlen)6);
	goto L100;
    }

    i__1 = (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    cfftmi_(l, &wsave[1], &i__1, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("CFFT2I", &c_n5, (ftnlen)6);
	goto L100;
    }
    i__1 = (*m << 1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    cfftmi_(m, &wsave[(*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + 3]
	    , &i__1, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("CFFT2I", &c_n5, (ftnlen)6);
    }

L100:
    return 0;
}